

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

int trico_write_uint32(void *a,uint32_t *attrib,uint32_t nr_of_attribs,trico_stream_type st)

{
  ssize_t sVar1;
  uint local_4098;
  uint local_4094;
  char *pcStack_4090;
  uint32_t bytes_written;
  uint8_t *compressed_buf;
  LZ4_stream_t **ppLStack_4080;
  uint estimateLen;
  LZ4_stream_t *lz4Stream;
  LZ4_stream_t lz4Stream_body;
  uint8_t *b4;
  uint8_t *b3;
  uint8_t *b2;
  uint8_t *b1;
  void *pvStack_30;
  uint8_t header;
  trico_archive *arch;
  trico_stream_type st_local;
  uint32_t nr_of_attribs_local;
  uint32_t *attrib_local;
  void *a_local;
  
  b1._7_1_ = (undefined1)st;
  pvStack_30 = a;
  arch._0_4_ = st;
  arch._4_4_ = nr_of_attribs;
  _st_local = attrib;
  attrib_local = (uint32_t *)a;
  sVar1 = write((int)&b1 + 7,(void *)0x1,1);
  if ((int)sVar1 == 0) {
    a_local._4_4_ = 0;
  }
  else {
    sVar1 = write((int)&arch + 4,(void *)0x4,1);
    if ((int)sVar1 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      b2 = (uint8_t *)trico_malloc((ulong)arch._4_4_);
      b3 = (uint8_t *)trico_malloc((ulong)arch._4_4_);
      b4 = (uint8_t *)trico_malloc((ulong)arch._4_4_);
      lz4Stream_body.table[0x803] = (unsigned_long_long)trico_malloc((ulong)arch._4_4_);
      trico_transpose_uint32_aos_to_soa
                (&b2,&b3,&b4,(uint8_t **)(lz4Stream_body.table + 0x803),_st_local,arch._4_4_);
      ppLStack_4080 = &lz4Stream;
      LZ4_initStream(ppLStack_4080,0x4020);
      if (arch._4_4_ < 0x7e000001) {
        local_4098 = arch._4_4_ + arch._4_4_ / 0xff + 0x10;
      }
      else {
        local_4098 = 0;
      }
      compressed_buf._4_4_ = local_4098;
      pcStack_4090 = (char *)trico_malloc((ulong)local_4098);
      local_4094 = LZ4_compress_default((char *)b2,pcStack_4090,arch._4_4_,compressed_buf._4_4_);
      sVar1 = write((int)&local_4094,(void *)0x4,1);
      if ((int)sVar1 == 0) {
        a_local._4_4_ = 0;
      }
      else {
        sVar1 = write((int)pcStack_4090,(void *)0x1,(ulong)local_4094);
        if ((int)sVar1 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          local_4094 = LZ4_compress_default((char *)b3,pcStack_4090,arch._4_4_,compressed_buf._4_4_)
          ;
          sVar1 = write((int)&local_4094,(void *)0x4,1);
          if ((int)sVar1 == 0) {
            a_local._4_4_ = 0;
          }
          else {
            sVar1 = write((int)pcStack_4090,(void *)0x1,(ulong)local_4094);
            if ((int)sVar1 == 0) {
              a_local._4_4_ = 0;
            }
            else {
              local_4094 = LZ4_compress_default
                                     ((char *)b4,pcStack_4090,arch._4_4_,compressed_buf._4_4_);
              sVar1 = write((int)&local_4094,(void *)0x4,1);
              if ((int)sVar1 == 0) {
                a_local._4_4_ = 0;
              }
              else {
                sVar1 = write((int)pcStack_4090,(void *)0x1,(ulong)local_4094);
                if ((int)sVar1 == 0) {
                  a_local._4_4_ = 0;
                }
                else {
                  local_4094 = LZ4_compress_default
                                         ((char *)lz4Stream_body.table[0x803],pcStack_4090,
                                          arch._4_4_,compressed_buf._4_4_);
                  sVar1 = write((int)&local_4094,(void *)0x4,1);
                  if ((int)sVar1 == 0) {
                    a_local._4_4_ = 0;
                  }
                  else {
                    sVar1 = write((int)pcStack_4090,(void *)0x1,(ulong)local_4094);
                    if ((int)sVar1 == 0) {
                      a_local._4_4_ = 0;
                    }
                    else {
                      trico_free(pcStack_4090);
                      trico_free(b2);
                      trico_free(b3);
                      trico_free(b4);
                      trico_free((void *)lz4Stream_body.table[0x803]);
                      a_local._4_4_ = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int trico_write_uint32(void* a, const uint32_t* attrib, uint32_t nr_of_attribs, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)st;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint8_t* b1 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b2 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b3 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b4 = (uint8_t*)trico_malloc(nr_of_attribs);

  trico_transpose_uint32_aos_to_soa(&b1, &b2, &b3, &b4, attrib, nr_of_attribs);

  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  unsigned estimateLen = LZ4_COMPRESSBOUND(nr_of_attribs);
  uint8_t* compressed_buf = (uint8_t*)trico_malloc(estimateLen);

  uint32_t bytes_written = (uint32_t)LZ4_compress_default((const char*)b1, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b2, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b3, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b4, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  trico_free(compressed_buf);

  trico_free(b1);
  trico_free(b2);
  trico_free(b3);
  trico_free(b4);

  return 1;
  }